

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

void __thiscall QMainWindowLayout::removeToolBarBreak(QMainWindowLayout *this,QToolBar *before)

{
  QToolBarAreaLayout::removeToolBarBreak((QToolBarAreaLayout *)(this + 0xa0),before);
  if ((*(int *)(this + 0x3c0) <= *(int *)(this + 0x3c8)) &&
     (*(int *)(this + 0x3c4) <= *(int *)(this + 0x3cc))) {
    QToolBarAreaLayout::removeToolBarBreak((QToolBarAreaLayout *)(this + 0x3d8),before);
  }
  (**(code **)(*(long *)this + 0x70))(this);
  return;
}

Assistant:

void QMainWindowLayout::removeToolBarBreak(QToolBar *before)
{
    layoutState.toolBarAreaLayout.removeToolBarBreak(before);
    if (savedState.isValid())
        savedState.toolBarAreaLayout.removeToolBarBreak(before);
    invalidate();
}